

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::blueprint_helpers::generateDigitsStem
               (int32_t minSig,int32_t maxSig,UnicodeString *sb,UErrorCode *param_4)

{
  anon_unknown.dwarf_18fdab::appendMultiple(sb,0x40,minSig);
  if (maxSig != -1) {
    anon_unknown.dwarf_18fdab::appendMultiple(sb,0x23,maxSig - minSig);
    return;
  }
  UnicodeString::append(sb,L'+');
  return;
}

Assistant:

void
blueprint_helpers::generateDigitsStem(int32_t minSig, int32_t maxSig, UnicodeString& sb, UErrorCode&) {
    appendMultiple(sb, u'@', minSig);
    if (maxSig == -1) {
        sb.append(u'+');
    } else {
        appendMultiple(sb, u'#', maxSig - minSig);
    }
}